

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmeta.cpp
# Opt level: O0

void __thiscall CVmMetaTable::create_intrinsic_class_instances(CVmMetaTable *this)

{
  long *in_RDI;
  CVmObjTable *unaff_retaddr;
  vm_meta_entry_t *entry;
  size_t idx;
  long local_18;
  ulong local_10;
  long *plVar1;
  
  local_10 = 0;
  local_18 = *in_RDI;
  plVar1 = in_RDI;
  for (; local_10 < (ulong)in_RDI[2]; local_10 = local_10 + 1) {
    if (*(int *)(local_18 + 0x10) == 0) {
      CVmObjClass::create_dyn(0);
    }
    CVmObjTable::add_to_globals(unaff_retaddr,(vm_obj_id_t)((ulong)plVar1 >> 0x20));
    local_18 = local_18 + 0x38;
  }
  return;
}

Assistant:

void CVmMetaTable::create_intrinsic_class_instances(VMG0_)
{
    size_t idx;
    vm_meta_entry_t *entry;
    
    /* go through our table */
    for (idx = 0, entry = table_ ; idx < count_ ; ++idx, ++entry)
    {
        /* if this entry has no associated class object, create one for it */
        if (entry->class_obj_ == VM_INVALID_OBJ)
        {
            /* 
             *   create the class object - it will automatically register
             *   itself to fill in the entry 
             */
            CVmObjClass::create_dyn(vmg_ idx);
        }

        /* 
         *   Add this object to the machine globals, if it's not a root
         *   object.  Any dynamically-created intrinsic class instance must
         *   be made a machine global because it will always be reachable as
         *   the class object for the metaclass, but the metclass won't trace
         *   the object during garbage collection, so we have to set up a
         *   global to make sure the gc knows it's always reachable.
         */
        G_obj_table->add_to_globals(entry->class_obj_);
    }
}